

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

char * telnet_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,
                  Conf *conf,char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  _Bool _Var1;
  int iVar2;
  Telnet *telnet_00;
  Conf *pCVar3;
  strbuf *psVar4;
  char *pcVar5;
  SockAddr *addr_00;
  Socket *pSVar6;
  Pinger *pPVar7;
  char *colon;
  Opt **o_1;
  Opt **o;
  int addressfamily;
  char *loghost;
  Telnet *telnet;
  char *err;
  SockAddr *addr;
  _Bool keepalive_local;
  _Bool nodelay_local;
  char *host_local;
  Conf *conf_local;
  LogContext *logctx_local;
  Backend **backend_handle_local;
  Seat *seat_local;
  BackendVtable *vt_local;
  
  telnet_00 = (Telnet *)safemalloc(1,200,0);
  memset(telnet_00,0,200);
  (telnet_00->plug).vt = &Telnet_plugvt;
  (telnet_00->backend).vt = vt;
  (telnet_00->interactor).vt = &Telnet_interactorvt;
  (telnet_00->backend).interactor = &telnet_00->interactor;
  pCVar3 = conf_copy(conf);
  telnet_00->conf = pCVar3;
  telnet_00->s = (Socket *)0x0;
  telnet_00->socket_connected = false;
  telnet_00->closed_on_socket_error = false;
  telnet_00->echoing = true;
  telnet_00->editing = true;
  telnet_00->activated = false;
  psVar4 = strbuf_new();
  telnet_00->sb_buf = psVar4;
  telnet_00->seat = seat;
  telnet_00->logctx = logctx;
  iVar2 = conf_get_int(telnet_00->conf,0x7d);
  telnet_00->term_width = iVar2;
  iVar2 = conf_get_int(telnet_00->conf,0x7e);
  telnet_00->term_height = iVar2;
  telnet_00->state = TOP_LEVEL;
  telnet_00->ldisc = (Ldisc *)0x0;
  telnet_00->pinger = (Pinger *)0x0;
  pcVar5 = default_description(vt,host,port);
  telnet_00->description = pcVar5;
  *backend_handle = &telnet_00->backend;
  iVar2 = conf_get_int(telnet_00->conf,3);
  addr_00 = name_lookup(host,port,realhost,telnet_00->conf,iVar2,telnet_00->logctx,
                        "Telnet connection");
  pcVar5 = sk_addr_error(addr_00);
  if (pcVar5 == (char *)0x0) {
    if (port < 0) {
      port = 0x17;
    }
    pSVar6 = new_connection(addr_00,*realhost,port,false,true,nodelay,keepalive,&telnet_00->plug,
                            telnet_00->conf,&telnet_00->interactor);
    telnet_00->s = pSVar6;
    pcVar5 = sk_socket_error(telnet_00->s);
    if (pcVar5 == (char *)0x0) {
      seat_set_trust_status(telnet_00->seat,false);
      pPVar7 = pinger_new(telnet_00->conf,&telnet_00->backend);
      telnet_00->pinger = pPVar7;
      _Var1 = conf_get_bool(telnet_00->conf,0x3d);
      if (_Var1) {
        for (o_1 = opts; *o_1 != (Opt *)0x0; o_1 = o_1 + 1) {
          telnet_00->opt_states[(*o_1)->index] = 2;
        }
      }
      else {
        for (colon = "<\x02\x1d"; *(long *)colon != 0; colon = colon + 8) {
          telnet_00->opt_states[*(int *)(*(long *)colon + 0x14)] = *(int *)(*(long *)colon + 0x18);
          if (telnet_00->opt_states[*(int *)(*(long *)colon + 0x14)] == 0) {
            send_opt(telnet_00,**(int **)colon,*(int *)(*(long *)colon + 0x10));
          }
        }
        telnet_00->activated = true;
      }
      telnet_00->in_synch = false;
      seat_update_specials_menu(telnet_00->seat);
      pcVar5 = conf_get_str(telnet_00->conf,9);
      if (*pcVar5 != '\0') {
        safefree(*realhost);
        pcVar5 = dupstr(pcVar5);
        *realhost = pcVar5;
        pcVar5 = host_strrchr(*realhost,0x3a);
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
        }
      }
      vt_local = (BackendVtable *)0x0;
    }
    else {
      vt_local = (BackendVtable *)dupstr(pcVar5);
    }
  }
  else {
    sk_addr_free(addr_00);
    vt_local = (BackendVtable *)dupstr(pcVar5);
  }
  return (char *)vt_local;
}

Assistant:

static char *telnet_init(const BackendVtable *vt, Seat *seat,
                         Backend **backend_handle, LogContext *logctx,
                         Conf *conf, const char *host, int port,
                         char **realhost, bool nodelay, bool keepalive)
{
    SockAddr *addr;
    const char *err;
    Telnet *telnet;
    char *loghost;
    int addressfamily;

    telnet = snew(Telnet);
    memset(telnet, 0, sizeof(Telnet));
    telnet->plug.vt = &Telnet_plugvt;
    telnet->backend.vt = vt;
    telnet->interactor.vt = &Telnet_interactorvt;
    telnet->backend.interactor = &telnet->interactor;
    telnet->conf = conf_copy(conf);
    telnet->s = NULL;
    telnet->socket_connected = false;
    telnet->closed_on_socket_error = false;
    telnet->echoing = true;
    telnet->editing = true;
    telnet->activated = false;
    telnet->sb_buf = strbuf_new();
    telnet->seat = seat;
    telnet->logctx = logctx;
    telnet->term_width = conf_get_int(telnet->conf, CONF_width);
    telnet->term_height = conf_get_int(telnet->conf, CONF_height);
    telnet->state = TOP_LEVEL;
    telnet->ldisc = NULL;
    telnet->pinger = NULL;
    telnet->description = default_description(vt, host, port);
    *backend_handle = &telnet->backend;

    /*
     * Try to find host.
     */
    addressfamily = conf_get_int(telnet->conf, CONF_addressfamily);
    addr = name_lookup(host, port, realhost, telnet->conf, addressfamily,
                       telnet->logctx, "Telnet connection");
    if ((err = sk_addr_error(addr)) != NULL) {
        sk_addr_free(addr);
        return dupstr(err);
    }

    if (port < 0)
        port = 23;                     /* default telnet port */

    /*
     * Open socket.
     */
    telnet->s = new_connection(addr, *realhost, port, false, true, nodelay,
                               keepalive, &telnet->plug, telnet->conf,
                               &telnet->interactor);
    if ((err = sk_socket_error(telnet->s)) != NULL)
        return dupstr(err);

    /* No local authentication phase in this protocol */
    seat_set_trust_status(telnet->seat, false);

    telnet->pinger = pinger_new(telnet->conf, &telnet->backend);

    /*
     * Initialise option states.
     */
    if (conf_get_bool(telnet->conf, CONF_passive_telnet)) {
        const struct Opt *const *o;

        for (o = opts; *o; o++)
            telnet->opt_states[(*o)->index] = INACTIVE;
    } else {
        const struct Opt *const *o;

        for (o = opts; *o; o++) {
            telnet->opt_states[(*o)->index] = (*o)->initial_state;
            if (telnet->opt_states[(*o)->index] == REQUESTED)
                send_opt(telnet, (*o)->send, (*o)->option);
        }
        telnet->activated = true;
    }

    /*
     * Set up SYNCH state.
     */
    telnet->in_synch = false;

    /*
     * We can send special commands from the start.
     */
    seat_update_specials_menu(telnet->seat);

    /*
     * loghost overrides realhost, if specified.
     */
    loghost = conf_get_str(telnet->conf, CONF_loghost);
    if (*loghost) {
        char *colon;

        sfree(*realhost);
        *realhost = dupstr(loghost);

        colon = host_strrchr(*realhost, ':');
        if (colon)
            *colon++ = '\0';
    }

    return NULL;
}